

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::AnimationRule>::emplace<QCss::AnimationRule_const&>
          (QMovableArrayOps<QCss::AnimationRule> *this,qsizetype i,AnimationRule *args)

{
  AnimationRule **ppAVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  AnimationRule local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
           super_QArrayDataPointer<QCss::AnimationRule>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::AnimationRule>).
        super_QArrayDataPointer<QCss::AnimationRule>.size == i) {
      qVar4 = QArrayDataPointer<QCss::AnimationRule>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::AnimationRule> *)this);
      if (qVar4 == 0) goto LAB_0054ddb7;
      QCss::AnimationRule::AnimationRule
                ((this->super_QGenericArrayOps<QCss::AnimationRule>).
                 super_QArrayDataPointer<QCss::AnimationRule>.ptr +
                 (this->super_QGenericArrayOps<QCss::AnimationRule>).
                 super_QArrayDataPointer<QCss::AnimationRule>.size,args);
LAB_0054dea6:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
                super_QArrayDataPointer<QCss::AnimationRule>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0054de65;
    }
LAB_0054ddb7:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QCss::AnimationRule>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::AnimationRule> *)this);
      if (qVar4 != 0) {
        QCss::AnimationRule::AnimationRule
                  ((this->super_QGenericArrayOps<QCss::AnimationRule>).
                   super_QArrayDataPointer<QCss::AnimationRule>.ptr + -1,args);
        ppAVar1 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
                   super_QArrayDataPointer<QCss::AnimationRule>.ptr;
        *ppAVar1 = *ppAVar1 + -1;
        goto LAB_0054dea6;
      }
    }
  }
  local_58.ruleSets.d.ptr = (AnimationRuleSet *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ruleSets.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.animName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ruleSets.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.animName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.animName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::AnimationRule::AnimationRule(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
          super_QArrayDataPointer<QCss::AnimationRule>.size != 0;
  QArrayDataPointer<QCss::AnimationRule>::detachAndGrow
            ((QArrayDataPointer<QCss::AnimationRule> *)this,(uint)(i == 0 && bVar5),1,
             (AnimationRule **)0x0,(QArrayDataPointer<QCss::AnimationRule> *)0x0);
  if (i == 0 && bVar5) {
    QCss::AnimationRule::AnimationRule
              ((this->super_QGenericArrayOps<QCss::AnimationRule>).
               super_QArrayDataPointer<QCss::AnimationRule>.ptr + -1,&local_58);
    ppAVar1 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
               super_QArrayDataPointer<QCss::AnimationRule>.ptr;
    *ppAVar1 = *ppAVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
              super_QArrayDataPointer<QCss::AnimationRule>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QCss::AnimationRule> *)this,i,1);
    QCss::AnimationRule::AnimationRule(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QCss::AnimationRule::~AnimationRule(&local_58);
LAB_0054de65:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }